

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

int __thiscall
glcts::TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init
          (vertexArrayObjectDefinition *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLenum GVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  int extraout_EAX_01;
  ulong uVar4;
  uint *in_RCX;
  long in_RDX;
  bufferCollection *in_R8;
  GLuint in_R9D;
  attributeDefinition *attribute;
  long lVar5;
  
  this->m_gl = (Functions *)ctx;
  (**(code **)(ctx + 0x708))(1,&this->m_vertex_array_object_id);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"Failed to generate VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d0);
  (*this->m_gl->bindVertexArray)(this->m_vertex_array_object_id);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"Failed to bind VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d3);
  iVar1 = *(int *)(in_RDX + 0x20);
  uVar4 = (ulong)*in_RCX;
  if (uVar4 < 4) {
    attribute = (attributeDefinition *)(&PTR_texture_attributes_02109e00)[uVar4];
    lVar5 = *(long *)(&DAT_01b74ee0 + uVar4 * 8);
    setupAttribute(this,(attributeDefinition *)&DAT_02109d58,in_R8,in_R9D);
    do {
      setupAttribute(this,attribute,in_R8,in_R9D);
      attribute = attribute + 1;
      lVar5 = lVar5 + -1;
      iVar3 = extraout_EAX;
    } while (lVar5 != 0);
  }
  else {
    setupAttribute(this,(attributeDefinition *)&DAT_02109d58,in_R8,in_R9D);
    iVar3 = extraout_EAX_00;
  }
  if (iVar1 != 3) {
    return iVar3;
  }
  setupAttribute(this,getAttributes::depth_attributes,in_R8,in_R9D);
  return extraout_EAX_01;
}

Assistant:

void TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init(const glw::Functions&   gl,
																		const formatDefinition& format,
																		const samplingFunction& sampling_function,
																		const bufferCollection& buffers,
																		glw::GLuint				program_id)
{
	m_gl = &gl;

	m_gl->genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to generate VAO.");

	m_gl->bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind VAO.");

	attributeDefinition		   positionAttribute = { vertex_shader_position, type_vec4, Position, 0 };
	const attributeDefinition* format_attributes;
	glw::GLuint				   n_format_attributes;
	const attributeDefinition* routine_attributes   = 0;
	glw::GLuint				   n_routine_attributes = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	setupAttribute(positionAttribute, buffers, program_id);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupAttribute(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupAttribute(format_attributes[i], buffers, program_id);
	}
}